

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::FixedRate::deltaRule(FixedRate *this,Array *var,Array *grad)

{
  float fVar1;
  float fVar2;
  int iVar3;
  size_t __n;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  size_t n;
  Array *grad_local;
  Array *var_local;
  FixedRate *this_local;
  
  __n = std::valarray<float>::size(var);
  if ((deltaRule(std::valarray<float>&,std::valarray<float>const&)::lastVar == '\0') &&
     (iVar3 = __cxa_guard_acquire(&deltaRule(std::valarray<float>&,std::valarray<float>const&)::
                                   lastVar), iVar3 != 0)) {
    std::valarray<float>::valarray(&deltaRule::lastVar);
    __cxa_atexit(std::valarray<float>::~valarray,&deltaRule::lastVar,&__dso_handle);
    __cxa_guard_release(&deltaRule(std::valarray<float>&,std::valarray<float>const&)::lastVar);
  }
  if ((this->weightDecay != 0.0) || (NAN(this->weightDecay))) {
    std::valarray<float>::resize(&deltaRule::lastVar,__n,0.0);
    std::valarray<float>::operator=(&deltaRule::lastVar,var);
  }
  fVar1 = this->learningRate;
  pfVar4 = std::begin<float>(grad);
  pfVar5 = std::end<float>(grad);
  pfVar6 = std::begin<float>(var);
  pfVar7 = std::end<float>(var);
  internal::scaleAdd<float_const*,float*>(-fVar1,pfVar4,pfVar5,pfVar6,pfVar7);
  if ((this->weightDecay != 0.0) || (NAN(this->weightDecay))) {
    fVar1 = this->learningRate;
    fVar2 = this->weightDecay;
    pfVar4 = std::begin<float>(&deltaRule::lastVar);
    pfVar5 = std::end<float>(&deltaRule::lastVar);
    pfVar6 = std::begin<float>(var);
    pfVar7 = std::end<float>(var);
    internal::scaleAdd<float*,float*>(fVar1 * -2.0 * fVar2,pfVar4,pfVar5,pfVar6,pfVar7);
  }
  return;
}

Assistant:

void deltaRule(Array& var, const Array &grad) {
        size_t n = var.size();
        static Array lastVar;
        if (weightDecay != 0) {
            lastVar.resize(n);
            lastVar = var;
        }
        // apply updates: var = var - eta * grad
        internal::scaleAdd(-learningRate,             // - eta
                std::begin(grad), std::end(grad),     // * grad
                std::begin(var), std::end(var));      // + var =: var
        // apply weight decay: var = var - 2 * eta * lambda * var
        if (weightDecay != 0) {
            internal::scaleAdd(- 2 * learningRate * weightDecay,
                std::begin(lastVar), std::end(lastVar),
                std::begin(var), std::end(var));
        }
    }